

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
cnn::LookupParameters::LookupParameters(LookupParameters *this,uint n,Dim *d,float scale)

{
  pointer pTVar1;
  Tensor *d_00;
  pointer pTVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float *pfVar11;
  ulong uVar12;
  ulong __n;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int iVar23;
  allocator_type local_4e;
  allocator_type local_4d;
  float local_4c;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_48;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_40;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_38;
  
  __n = (ulong)n;
  (this->super_ParametersBase)._vptr_ParametersBase = (_func_int **)&PTR_scale_parameters_002a0878;
  uVar6 = *(undefined8 *)(d->d + 2);
  uVar9 = *(undefined8 *)(d->d + 4);
  uVar10 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->dim).d = *(undefined8 *)d->d;
  *(undefined8 *)((this->dim).d + 2) = uVar6;
  *(undefined8 *)((this->dim).d + 4) = uVar9;
  *(undefined8 *)((this->dim).d + 6) = uVar10;
  (this->dim).bd = d->bd;
  local_38 = &this->values;
  local_4c = scale;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(local_38,__n,&local_4d);
  local_40 = &this->grads;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(local_40,__n,&local_4e);
  (this->non_zero_grads)._M_h._M_buckets = &(this->non_zero_grads)._M_h._M_single_bucket;
  (this->non_zero_grads)._M_h._M_bucket_count = 1;
  (this->non_zero_grads)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->non_zero_grads)._M_h._M_element_count = 0;
  (this->non_zero_grads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->non_zero_grads)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  if (n != 0) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    local_48 = &this->non_zero_grads;
    uVar13 = 0;
    do {
      pTVar2 = (local_38->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2[uVar13].d.bd = d->bd;
      uVar6 = *(undefined8 *)(d->d + 2);
      uVar9 = *(undefined8 *)(d->d + 4);
      uVar10 = *(undefined8 *)(d->d + 6);
      pTVar1 = pTVar2 + uVar13;
      *(undefined8 *)(pTVar1->d).d = *(undefined8 *)d->d;
      *(undefined8 *)((pTVar1->d).d + 2) = uVar6;
      *(undefined8 *)((pTVar1->d).d + 4) = uVar9;
      *(undefined8 *)((pTVar1->d).d + 6) = uVar10;
      if ((ulong)d->nd == 0) {
        iVar23 = 1;
      }
      else {
        auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar19 = vpbroadcastq_avx512f();
        uVar12 = 0;
        do {
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vmovdqa64_avx512f(auVar18);
          auVar18 = vporq_avx512f(auVar20,auVar16);
          auVar20 = vporq_avx512f(auVar20,auVar17);
          uVar6 = vpcmpuq_avx512f(auVar20,auVar19,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar18,auVar19,2);
          bVar8 = (byte)uVar6;
          uVar14 = CONCAT11(bVar8,bVar7);
          auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(d->d + uVar12));
          auVar20._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
          auVar20._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_;
          auVar20._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
          auVar20._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
          auVar20._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
          auVar20._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
          auVar20._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
          auVar20._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
          auVar20._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_;
          auVar20._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar18._36_4_;
          auVar20._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar18._40_4_;
          auVar20._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar18._44_4_;
          auVar20._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar18._48_4_;
          auVar20._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar18._52_4_;
          auVar20._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar18._56_4_;
          auVar20._60_4_ = (uint)(bVar8 >> 7) * auVar18._60_4_;
          uVar12 = uVar12 + 0x10;
          auVar18 = vpmulld_avx512f(auVar20,auVar21);
        } while (((ulong)d->nd + 0xf & 0x1fffffff0) != uVar12);
        auVar16 = vmovdqa32_avx512f(auVar18);
        auVar17._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._0_4_
        ;
        bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar17._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar21._4_4_;
        bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar17._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar21._8_4_;
        bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar17._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar21._12_4_;
        bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar17._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar21._16_4_;
        bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar17._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar21._20_4_;
        bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar17._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar21._24_4_;
        bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
        auVar17._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar21._28_4_;
        auVar17._32_4_ =
             (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar21._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar17._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar21._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar17._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar21._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar17._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar21._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar17._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar21._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar17._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar21._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar17._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar21._56_4_;
        auVar17._60_4_ =
             (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar21._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar17,1);
        auVar16 = vpmulld_avx512f(auVar17,ZEXT3264(auVar15));
        auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        iVar23 = auVar4._0_4_;
      }
      pfVar11 = (float *)AlignedMemoryPool<6U>::allocate(ps,(ulong)(iVar23 * d->bd) << 2);
      d_00 = pTVar2 + uVar13;
      d_00->v = pfVar11;
      if (local_4c == 0.0) {
        TensorTools::Randomize(d_00);
      }
      else {
        TensorTools::Randomize(d_00,local_4c);
      }
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pTVar2 = (local_40->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2[uVar13].d.bd = d->bd;
      uVar6 = *(undefined8 *)(d->d + 2);
      uVar9 = *(undefined8 *)(d->d + 4);
      uVar10 = *(undefined8 *)(d->d + 6);
      pTVar1 = pTVar2 + uVar13;
      *(undefined8 *)(pTVar1->d).d = *(undefined8 *)d->d;
      *(undefined8 *)((pTVar1->d).d + 2) = uVar6;
      *(undefined8 *)((pTVar1->d).d + 4) = uVar9;
      *(undefined8 *)((pTVar1->d).d + 6) = uVar10;
      if ((ulong)d->nd == 0) {
        iVar23 = 1;
      }
      else {
        auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar19 = vpbroadcastq_avx512f();
        uVar12 = 0;
        do {
          auVar20 = vpbroadcastq_avx512f();
          auVar21 = vmovdqa64_avx512f(auVar18);
          auVar18 = vporq_avx512f(auVar20,auVar16);
          auVar20 = vporq_avx512f(auVar20,auVar17);
          uVar6 = vpcmpuq_avx512f(auVar20,auVar19,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar18,auVar19,2);
          bVar8 = (byte)uVar6;
          uVar14 = CONCAT11(bVar8,bVar7);
          auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(d->d + uVar12));
          auVar22._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
          auVar22._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_;
          auVar22._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
          auVar22._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
          auVar22._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
          auVar22._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
          auVar22._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
          auVar22._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
          auVar22._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_;
          auVar22._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar18._36_4_;
          auVar22._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar18._40_4_;
          auVar22._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar18._44_4_;
          auVar22._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar18._48_4_;
          auVar22._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar18._52_4_;
          auVar22._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar18._56_4_;
          auVar22._60_4_ = (uint)(bVar8 >> 7) * auVar18._60_4_;
          uVar12 = uVar12 + 0x10;
          auVar18 = vpmulld_avx512f(auVar22,auVar21);
        } while (((ulong)d->nd + 0xf & 0x1fffffff0) != uVar12);
        auVar16 = vmovdqa32_avx512f(auVar18);
        auVar18._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._0_4_
        ;
        bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar18._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar21._4_4_;
        bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar18._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar21._8_4_;
        bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar18._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar21._12_4_;
        bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar18._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar21._16_4_;
        bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar18._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar21._20_4_;
        bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar18._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar21._24_4_;
        bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
        auVar18._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar21._28_4_;
        auVar18._32_4_ =
             (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar21._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar18._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar21._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar18._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar21._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar18._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar21._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar18._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar21._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar18._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar21._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar18._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar21._56_4_;
        auVar18._60_4_ =
             (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar21._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar18,1);
        auVar16 = vpmulld_avx512f(auVar18,ZEXT3264(auVar15));
        auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        iVar23 = auVar4._0_4_;
      }
      pfVar11 = (float *)AlignedMemoryPool<6U>::allocate(ps,(ulong)(iVar23 * d->bd) << 2);
      pTVar2[uVar13].v = pfVar11;
      TensorTools::Zero(pTVar2 + uVar13);
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar13 = uVar13 + 1;
    } while (uVar13 != __n);
  }
  return;
}

Assistant:

LookupParameters::LookupParameters(unsigned n, const Dim& d, float scale) : dim(d), values(n), grads(n) {
  for (unsigned i = 0; i < n; ++i) {
    auto& v = values[i];
    v.d = d;
    v.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    if(scale) TensorTools::Randomize(v,scale);
    else TensorTools::Randomize(v);

    auto& g = grads[i];
    g.d = d;
    g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    TensorTools::Zero(g);
  }
}